

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

void testing::internal::UniversalPrintCharArray<wchar_t>(wchar_t *begin,size_t len,ostream *os)

{
  ostream *os_local;
  size_t len_local;
  wchar_t *begin_local;
  
  if ((len == 0) || (begin[len - 1] != L'\0')) {
    PrintCharsAsStringTo<wchar_t>(begin,len,os);
    std::operator<<(os," (no terminating NUL)");
  }
  else {
    PrintCharsAsStringTo<wchar_t>(begin,len - 1,os);
  }
  return;
}

Assistant:

static void UniversalPrintCharArray(
    const CharType* begin, size_t len, ostream* os) {
  // The code
  //   const char kFoo[] = "foo";
  // generates an array of 4, not 3, elements, with the last one being '\0'.
  //
  // Therefore when printing a char array, we don't print the last element if
  // it's '\0', such that the output matches the string literal as it's
  // written in the source code.
  if (len > 0 && begin[len - 1] == '\0') {
    PrintCharsAsStringTo(begin, len - 1, os);
    return;
  }

  // If, however, the last element in the array is not '\0', e.g.
  //    const char kFoo[] = { 'f', 'o', 'o' };
  // we must print the entire array.  We also print a message to indicate
  // that the array is not NUL-terminated.
  PrintCharsAsStringTo(begin, len, os);
  *os << " (no terminating NUL)";
}